

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O1

char * sx_snprintf_alloc(sx_alloc *alloc,char *fmt,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  __va_list_tag local_2f8;
  undefined1 local_2d8 [16];
  undefined8 local_2c8;
  undefined8 local_2c0;
  undefined8 local_2b8;
  undefined8 local_2b0;
  undefined8 local_2a8;
  undefined8 local_298;
  undefined8 local_288;
  undefined8 local_278;
  undefined8 local_268;
  undefined8 local_258;
  undefined8 local_248;
  undefined8 local_238;
  sx_alloc *local_220;
  char *local_218;
  int local_210;
  char local_20c [516];
  
  local_2f8.reg_save_area = local_2d8;
  if (in_AL != '\0') {
    local_2a8 = in_XMM0_Qa;
    local_298 = in_XMM1_Qa;
    local_288 = in_XMM2_Qa;
    local_278 = in_XMM3_Qa;
    local_268 = in_XMM4_Qa;
    local_258 = in_XMM5_Qa;
    local_248 = in_XMM6_Qa;
    local_238 = in_XMM7_Qa;
  }
  local_2f8.overflow_arg_area = &args[0].overflow_arg_area;
  local_2f8.gp_offset = 0x10;
  local_2f8.fp_offset = 0x30;
  local_218 = (char *)0x0;
  local_210 = 0;
  local_2c8 = in_RDX;
  local_2c0 = in_RCX;
  local_2b8 = in_R8;
  local_2b0 = in_R9;
  local_220 = alloc;
  stbsp_vsprintfcb(sx__vsnprintf_callback,&local_220,local_20c,fmt,&local_2f8);
  local_218[local_210] = '\0';
  return local_218;
}

Assistant:

char* sx_snprintf_alloc(const sx_alloc* alloc, const char* fmt, ...)
{
    va_list args;
    va_start(args, fmt);
    char* str = sx_vsnprintf_alloc(alloc, fmt, args);
    va_end(args);
    return str;
}